

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QLocale *l)

{
  long lVar1;
  QLocalePrivate *pQVar2;
  QDebug *pQVar3;
  long *in_RDX;
  char *pcVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QDebugStateSaver saver;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QDebugStateSaver local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_38,(QDebug *)l);
  QLocale::system((char *)&local_50);
  lVar1._0_4_ = ((local_50.d)->super_QArrayData).ref_;
  lVar1._4_4_ = ((local_50.d)->super_QArrayData).flags;
  if (*(long *)*in_RDX == lVar1) {
    bVar5 = (int)((long *)*in_RDX)[3] == (int)local_50.d[1].super_QArrayData.alloc;
  }
  else {
    bVar5 = false;
  }
  QLocale::~QLocale((QLocale *)&local_50);
  *(undefined2 *)&(l->d).d.ptr[1].m_index = 0x100;
  pcVar4 = "QLocale(";
  if (bVar5) {
    pcVar4 = "QLocale::system()/* ";
  }
  pQVar3 = QDebug::operator<<((QDebug *)l,pcVar4);
  QLocale::languageToString((QString *)&local_50,**(Language **)*in_RDX);
  pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_50);
  pQVar3 = QDebug::operator<<(pQVar3,", ");
  QLocale::scriptToString((QString *)&local_68,*(Script *)(*(long *)*in_RDX + 2));
  pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_68);
  pQVar3 = QDebug::operator<<(pQVar3,", ");
  QLocale::territoryToString((QString *)&local_80,*(Territory *)(*(long *)*in_RDX + 4));
  pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_80);
  pcVar4 = ")";
  if (bVar5) {
    pcVar4 = " */";
  }
  QDebug::operator<<(pQVar3,pcVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = (l->d).d.ptr;
  (l->d).d.ptr = (QLocalePrivate *)0x0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QLocale &l)
{
    QDebugStateSaver saver(dbg);
    const bool isSys = l == QLocale::system();
    dbg.nospace().noquote()
        << (isSys ? "QLocale::system()/* " : "QLocale(")
        << QLocale::languageToString(l.language()) << ", "
        << QLocale::scriptToString(l.script()) << ", "
        << QLocale::territoryToString(l.territory()) << (isSys ? " */" : ")");
    return dbg;
}